

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O0

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Lookup
          (PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          float_na_equal *value)

{
  bool bVar1;
  hash_t hVar2;
  float *right;
  float_na_equal *in_RSI;
  long in_RDI;
  uint64_t offset;
  undefined8 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar3;
  undefined8 local_18;
  
  hVar2 = Hash<duckdb::float_na_equal>(SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x20,0));
  local_18 = hVar2 & *(ulong *)(in_RDI + 0x20);
  while( true ) {
    bVar1 = primitive_dictionary_entry_t::IsEmpty
                      ((primitive_dictionary_entry_t *)(*(long *)(in_RDI + 0x90) + local_18 * 8));
    uVar3 = false;
    if (!bVar1) {
      right = (float *)(*(long *)(in_RDI + 0x90) + local_18 * 8);
      float_na_equal::operator_cast_to_float(in_RSI);
      uVar3 = float_na_equal::operator!=
                        ((float_na_equal *)CONCAT17(uVar3,in_stack_ffffffffffffffd0),right);
    }
    if ((bool)uVar3 == false) break;
    local_18 = *(ulong *)(in_RDI + 0x20) & local_18 + 1;
  }
  return (primitive_dictionary_entry_t *)(*(long *)(in_RDI + 0x90) + local_18 * 8);
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}